

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcSetLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,int iLit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    iVar1 = pObj->Id;
    if ((long)iVar1 < 0) goto LAB_0055fe5d;
    iVar2 = p->vMapping->nSize;
    if (iVar2 <= iVar1) goto LAB_0055fe5d;
    iVar1 = p->vMapping->pArray[iVar1];
    if (iVar1 == 0) {
LAB_0055feba:
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                    ,900,"int Saig_ManBmcSetLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int, int)");
    }
    if ((iVar1 < 0) || (iVar2 <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if (iVar1 == 0) goto LAB_0055feba;
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vId2Num->nSize)) {
    if ((iFrame < 0) || (p->vId2Var->nSize <= iFrame)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar3 = p->vId2Num->pArray[iVar1];
    if ((-1 < (int)uVar3) &&
       (pvVar4 = p->vId2Var->pArray[(uint)iFrame], (int)uVar3 < *(int *)((long)pvVar4 + 4))) {
      *(int *)(*(long *)((long)pvVar4 + 8) + (ulong)uVar3 * 4) = iLit;
      return iLit;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_0055fe5d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Saig_ManBmcSetLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, int iLit )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    Vec_IntWriteEntry( vFrame, ObjNum, iLit );
/*
    if ( Vec_IntEntry( p->vMapRefs, Aig_ObjId(pObj) ) > 1 )
        p->nLitUsed++;
    else
        p->nLitUseless++;
*/
    return iLit;
}